

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::AdvancedUnsizedArrayLength2::BuildShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  string *psVar1;
  ostream *poVar2;
  string *local_ef8;
  string *local_ee0;
  allocator<char> local_bc1;
  string local_bc0 [8];
  string lastelemexpr;
  string local_b98 [8];
  string expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b50;
  byte local_b2b;
  allocator<char> local_b2a;
  byte local_b29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b08;
  byte local_ae3;
  allocator<char> local_ae2;
  byte local_ae1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  byte local_a9b;
  allocator<char> local_a9a;
  byte local_a99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a78;
  byte local_a53;
  allocator<char> local_a52;
  byte local_a51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  byte local_a0b;
  allocator<char> local_a0a;
  byte local_a09;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a8;
  undefined1 local_688 [8];
  string decl;
  string local_658 [8];
  string l [4];
  allocator<char> local_5c9;
  undefined1 local_5c8 [8];
  string lo;
  undefined1 local_5a0 [8];
  string sd;
  allocator<char> local_577;
  allocator<char> local_576;
  allocator<char> local_575;
  allocator<char> local_574;
  allocator<char> local_573;
  allocator<char> local_572;
  allocator<char> local_571;
  string *local_570;
  undefined1 local_568;
  allocator<char> local_567;
  allocator<char> local_566;
  allocator<char> local_565;
  allocator<char> local_564;
  allocator<char> local_563;
  allocator<char> local_562;
  allocator<char> local_561;
  string *local_560;
  undefined1 local_558;
  allocator<char> local_557;
  allocator<char> local_556;
  allocator<char> local_555;
  allocator<char> local_554;
  allocator<char> local_553;
  allocator<char> local_552;
  allocator<char> local_551;
  string *local_550;
  undefined1 local_543;
  allocator<char> local_542;
  allocator<char> local_541;
  allocator<char> local_540;
  allocator<char> local_53f;
  allocator<char> local_53e;
  allocator<char> local_53d [20];
  allocator<char> local_529;
  string *local_528;
  string *local_520;
  string local_518 [8];
  string e [4] [7];
  undefined1 local_190 [8];
  ostringstream os;
  AdvancedUnsizedArrayLength2 *this_local;
  
  os._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  sd.field_2._M_local_buf[0xf] = '\x01';
  local_543 = 1;
  local_528 = local_518;
  local_520 = local_518;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_518,"bvec3",&local_529);
  psVar1 = (string *)(e[0][0].field_2._M_local_buf + 8);
  local_528 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"vec4",local_53d);
  psVar1 = (string *)(e[0][1].field_2._M_local_buf + 8);
  local_528 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"ivec3",&local_53e);
  psVar1 = (string *)(e[0][2].field_2._M_local_buf + 8);
  local_528 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"ivec3",&local_53f);
  psVar1 = (string *)(e[0][3].field_2._M_local_buf + 8);
  local_528 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"uvec2",&local_540);
  psVar1 = (string *)(e[0][4].field_2._M_local_buf + 8);
  local_528 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"vec2",&local_541);
  psVar1 = (string *)(e[0][5].field_2._M_local_buf + 8);
  local_528 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"uvec4",&local_542);
  local_543 = 0;
  psVar1 = (string *)(e[0][6].field_2._M_local_buf + 8);
  local_558 = 1;
  local_550 = psVar1;
  local_520 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"mat2",&local_551);
  psVar1 = (string *)(e[1][0].field_2._M_local_buf + 8);
  local_550 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"mat3",&local_552);
  psVar1 = (string *)(e[1][1].field_2._M_local_buf + 8);
  local_550 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"mat4",&local_553);
  psVar1 = (string *)(e[1][2].field_2._M_local_buf + 8);
  local_550 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"mat4",&local_554);
  psVar1 = (string *)(e[1][3].field_2._M_local_buf + 8);
  local_550 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"mat2x3",&local_555);
  psVar1 = (string *)(e[1][4].field_2._M_local_buf + 8);
  local_550 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"mat3x2",&local_556);
  psVar1 = (string *)(e[1][5].field_2._M_local_buf + 8);
  local_550 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"mat4x2",&local_557);
  local_558 = 0;
  psVar1 = (string *)(e[1][6].field_2._M_local_buf + 8);
  local_568 = 1;
  local_560 = psVar1;
  local_520 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"mat2",&local_561);
  psVar1 = (string *)(e[2][0].field_2._M_local_buf + 8);
  local_560 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"mat3",&local_562);
  psVar1 = (string *)(e[2][1].field_2._M_local_buf + 8);
  local_560 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"mat4",&local_563);
  psVar1 = (string *)(e[2][2].field_2._M_local_buf + 8);
  local_560 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"mat4",&local_564);
  psVar1 = (string *)(e[2][3].field_2._M_local_buf + 8);
  local_560 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"mat2x3",&local_565);
  psVar1 = (string *)(e[2][4].field_2._M_local_buf + 8);
  local_560 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"mat3x2",&local_566);
  psVar1 = (string *)(e[2][5].field_2._M_local_buf + 8);
  local_560 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"mat4x2",&local_567);
  local_568 = 0;
  psVar1 = (string *)(e[2][6].field_2._M_local_buf + 8);
  local_570 = psVar1;
  local_520 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"S0",&local_571);
  psVar1 = (string *)(e[3][0].field_2._M_local_buf + 8);
  local_570 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"S1",&local_572);
  psVar1 = (string *)(e[3][1].field_2._M_local_buf + 8);
  local_570 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"S2",&local_573);
  psVar1 = (string *)(e[3][2].field_2._M_local_buf + 8);
  local_570 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"S2",&local_574);
  psVar1 = (string *)(e[3][3].field_2._M_local_buf + 8);
  local_570 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"S4",&local_575);
  psVar1 = (string *)(e[3][4].field_2._M_local_buf + 8);
  local_570 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"S5",&local_576);
  psVar1 = (string *)(e[3][5].field_2._M_local_buf + 8);
  local_570 = psVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(psVar1,"S6",&local_577);
  sd.field_2._M_local_buf[0xf] = '\0';
  std::allocator<char>::~allocator(&local_577);
  std::allocator<char>::~allocator(&local_576);
  std::allocator<char>::~allocator(&local_575);
  std::allocator<char>::~allocator(&local_574);
  std::allocator<char>::~allocator(&local_573);
  std::allocator<char>::~allocator(&local_572);
  std::allocator<char>::~allocator(&local_571);
  std::allocator<char>::~allocator(&local_567);
  std::allocator<char>::~allocator(&local_566);
  std::allocator<char>::~allocator(&local_565);
  std::allocator<char>::~allocator(&local_564);
  std::allocator<char>::~allocator(&local_563);
  std::allocator<char>::~allocator(&local_562);
  std::allocator<char>::~allocator(&local_561);
  std::allocator<char>::~allocator(&local_557);
  std::allocator<char>::~allocator(&local_556);
  std::allocator<char>::~allocator(&local_555);
  std::allocator<char>::~allocator(&local_554);
  std::allocator<char>::~allocator(&local_553);
  std::allocator<char>::~allocator(&local_552);
  std::allocator<char>::~allocator(&local_551);
  std::allocator<char>::~allocator(&local_542);
  std::allocator<char>::~allocator(&local_541);
  std::allocator<char>::~allocator(&local_540);
  std::allocator<char>::~allocator(&local_53f);
  std::allocator<char>::~allocator(&local_53e);
  std::allocator<char>::~allocator(local_53d);
  std::allocator<char>::~allocator(&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_5a0,
             "\nstruct S0 {\n  float f;\n  int i;\n  uint ui;\n  bool b;\n};\nstruct S1 {\n  ivec3 iv;\n  bvec2 bv;\n  vec4 v;\n  uvec2 uv;\n};\nstruct S2 {\n  mat2x2 m22;\n  mat4x4 m44;\n  mat2x3 m23;\n  mat4x2 m42;\n  mat3x4 m34;\n};\nstruct S4 {\n  float f[1];\n  int i[2];\n  uint ui[3];\n  bool b[4];\n  ivec3 iv[5];\n  bvec2 bv[6];\n  vec4  v[7];\n  uvec2 uv[8];\n};\nstruct S5 {\n  S0 s0;\n  S1 s1;\n  S2 s2;\n};\nstruct S6 {\n  S4 s4[3];\n};"
             ,(allocator<char> *)(lo.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(lo.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_5c8,"",&local_5c9);
  std::allocator<char>::~allocator(&local_5c9);
  decl.field_2._M_local_buf[0xb] = '\x01';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_658,"std140",(allocator<char> *)(decl.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(l[0].field_2._M_local_buf + 8),"std430",
             (allocator<char> *)(decl.field_2._M_local_buf + 0xe));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(l[1].field_2._M_local_buf + 8),"shared",
             (allocator<char> *)(decl.field_2._M_local_buf + 0xd));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(l[2].field_2._M_local_buf + 8),"packed",
             (allocator<char> *)(decl.field_2._M_local_buf + 0xc));
  decl.field_2._M_local_buf[0xb] = '\0';
  std::allocator<char>::~allocator((allocator<char> *)(decl.field_2._M_local_buf + 0xc));
  std::allocator<char>::~allocator((allocator<char> *)(decl.field_2._M_local_buf + 0xd));
  std::allocator<char>::~allocator((allocator<char> *)(decl.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(decl.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=
            ((string *)local_5c8,
             (string *)(l[(long)*(int *)((long)this + 0x58) + -1].field_2._M_local_buf + 8));
  if (*(int *)((long)this + 0x54) == 2) {
    std::__cxx11::string::operator+=((string *)local_5c8,", row_major");
  }
  std::operator+(&local_9c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0,
                 "\nlayout(");
  std::operator+(&local_9a8,&local_9c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c8);
  std::operator+(&local_988,&local_9a8,") buffer;\nlayout(binding = 0) readonly buffer Input0 {");
  local_a09 = 0;
  local_a0b = 0;
  if ((*(byte *)((long)this + 0x5c) & 1) == 0) {
    std::allocator<char>::allocator();
    local_a0b = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9e8,"",&local_a0a);
  }
  else {
    std::operator+(&local_a08,"\n  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&e[(long)*(int *)((long)this + 0x54) + -1][6].field_2 + 8));
    local_a09 = 1;
    std::operator+(&local_9e8,&local_a08," pad0;");
  }
  std::operator+(&local_968,&local_988,&local_9e8);
  std::operator+(&local_948,&local_968,"\n  ");
  std::operator+(&local_928,&local_948,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&e[(long)*(int *)((long)this + 0x54) + -1][6].field_2 + 8));
  std::operator+(&local_908,&local_928,
                 " g_input0[];\n};\nlayout(binding = 1) readonly buffer Input1 {");
  local_a51 = 0;
  local_a53 = 0;
  if ((*(byte *)((long)this + 0x5c) & 1) == 0) {
    std::allocator<char>::allocator();
    local_a53 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a30,"",&local_a52);
  }
  else {
    std::operator+(&local_a50,"\n  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&e[*(int *)((long)this + 0x54)][0].field_2 + 8));
    local_a51 = 1;
    std::operator+(&local_a30,&local_a50," pad1;");
  }
  std::operator+(&local_8e8,&local_908,&local_a30);
  std::operator+(&local_8c8,&local_8e8,"\n  ");
  std::operator+(&local_8a8,&local_8c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&e[*(int *)((long)this + 0x54)][0].field_2 + 8));
  std::operator+(&local_888,&local_8a8,
                 " data[];\n} g_input1;\nlayout(binding = 2) readonly buffer Input23 {");
  local_a99 = 0;
  local_a9b = 0;
  if ((*(byte *)((long)this + 0x5c) & 1) == 0) {
    std::allocator<char>::allocator();
    local_a9b = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a78,"",&local_a9a);
  }
  else {
    std::operator+(&local_a98,"\n  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&e[*(int *)((long)this + 0x54)][1].field_2 + 8));
    local_a99 = 1;
    std::operator+(&local_a78,&local_a98," pad2;");
  }
  std::operator+(&local_868,&local_888,&local_a78);
  std::operator+(&local_848,&local_868,"\n  ");
  std::operator+(&local_828,&local_848,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&e[*(int *)((long)this + 0x54)][1].field_2 + 8));
  std::operator+(&local_808,&local_828,
                 " data[];\n} g_input23[2];\nlayout(binding = 4) buffer Output0 {");
  local_ae1 = 0;
  local_ae3 = 0;
  if ((*(byte *)((long)this + 0x5c) & 1) == 0) {
    std::allocator<char>::allocator();
    local_ae3 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ac0,"",&local_ae2);
  }
  else {
    std::operator+(&local_ae0,"\n  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&e[*(int *)((long)this + 0x54)][3].field_2 + 8));
    local_ae1 = 1;
    std::operator+(&local_ac0,&local_ae0," pad4;");
  }
  std::operator+(&local_7e8,&local_808,&local_ac0);
  std::operator+(&local_7c8,&local_7e8,"\n  ");
  std::operator+(&local_7a8,&local_7c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&e[*(int *)((long)this + 0x54)][3].field_2 + 8));
  std::operator+(&local_788,&local_7a8,
                 " data[];\n} g_output0;\nlayout(binding = 5) readonly buffer Input4 {");
  local_b29 = 0;
  local_b2b = 0;
  if ((*(byte *)((long)this + 0x5c) & 1) == 0) {
    std::allocator<char>::allocator();
    local_b2b = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b08,"",&local_b2a);
  }
  else {
    std::operator+(&local_b28,"\n  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&e[*(int *)((long)this + 0x54)][4].field_2 + 8));
    local_b29 = 1;
    std::operator+(&local_b08,&local_b28," pad5;");
  }
  std::operator+(&local_768,&local_788,&local_b08);
  std::operator+(&local_748,&local_768,"\n  ");
  std::operator+(&local_728,&local_748,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&e[*(int *)((long)this + 0x54)][4].field_2 + 8));
  std::operator+(&local_708,&local_728," data[];\n} g_input4;\nlayout(binding = 6) buffer Output1 {"
                );
  expr.field_2._M_local_buf[0xf] = '\0';
  expr.field_2._M_local_buf[0xd] = '\0';
  if ((*(byte *)((long)this + 0x5c) & 1) == 0) {
    std::allocator<char>::allocator();
    expr.field_2._M_local_buf[0xd] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b50,"",(allocator<char> *)(expr.field_2._M_local_buf + 0xe));
  }
  else {
    std::operator+(&local_b70,"\n  ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&e[*(int *)((long)this + 0x54)][5].field_2 + 8));
    expr.field_2._M_local_buf[0xf] = '\x01';
    std::operator+(&local_b50,&local_b70," pad6;");
  }
  std::operator+(&local_6e8,&local_708,&local_b50);
  std::operator+(&local_6c8,&local_6e8,"\n  ");
  std::operator+(&local_6a8,&local_6c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&e[*(int *)((long)this + 0x54)][5].field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_688,
                 &local_6a8,
                 " data[];\n} g_output1;\nlayout(std430, binding = 7) buffer Output {\n  int g_length[];\n};"
                );
  std::__cxx11::string::~string((string *)&local_6a8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_b50);
  if ((expr.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(expr.field_2._M_local_buf + 0xe));
  }
  if ((expr.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_b70);
  }
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_748);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_b08);
  if ((local_b2b & 1) != 0) {
    std::allocator<char>::~allocator(&local_b2a);
  }
  if ((local_b29 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b28);
  }
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_7c8);
  std::__cxx11::string::~string((string *)&local_7e8);
  std::__cxx11::string::~string((string *)&local_ac0);
  if ((local_ae3 & 1) != 0) {
    std::allocator<char>::~allocator(&local_ae2);
  }
  if ((local_ae1 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_ae0);
  }
  std::__cxx11::string::~string((string *)&local_808);
  std::__cxx11::string::~string((string *)&local_828);
  std::__cxx11::string::~string((string *)&local_848);
  std::__cxx11::string::~string((string *)&local_868);
  std::__cxx11::string::~string((string *)&local_a78);
  if ((local_a9b & 1) != 0) {
    std::allocator<char>::~allocator(&local_a9a);
  }
  if ((local_a99 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a98);
  }
  std::__cxx11::string::~string((string *)&local_888);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string((string *)&local_8e8);
  std::__cxx11::string::~string((string *)&local_a30);
  if ((local_a53 & 1) != 0) {
    std::allocator<char>::~allocator(&local_a52);
  }
  if ((local_a51 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a50);
  }
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::string::~string((string *)&local_928);
  std::__cxx11::string::~string((string *)&local_948);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_9e8);
  if ((local_a0b & 1) != 0) {
    std::allocator<char>::~allocator(&local_a0a);
  }
  if ((local_a09 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a08);
  }
  std::__cxx11::string::~string((string *)&local_988);
  std::__cxx11::string::~string((string *)&local_9a8);
  std::__cxx11::string::~string((string *)&local_9c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b98,
             "\n  g_length[0] = g_input0.length();\n  g_length[1] = g_input1.data.length();\n  g_length[2] = g_input23[0].data.length();\n  g_length[3] = g_input23[1].data.length();\n  g_length[4] = g_output0.data.length();\n  g_length[5] = g_input4.data.length();\n  g_length[6] = g_output1.data.length();"
             ,(allocator<char> *)(lastelemexpr.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(lastelemexpr.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_bc0,
             "\n  g_output0.data[g_output0.data.length()-2] += g_output0.data[g_output0.data.length()-1];\n  g_output1.data[g_output1.data.length()-2] += g_output1.data[g_output1.data.length()-1];"
             ,&local_bc1);
  std::allocator<char>::~allocator(&local_bc1);
  if ((*(byte *)((long)this + 100) & 1) != 0) {
    std::__cxx11::string::operator+=(local_b98,local_bc0);
  }
  if (*(int *)((long)this + 0x50) == 0) {
    poVar2 = std::operator<<((ostream *)local_190,(string *)local_688);
    poVar2 = std::operator<<(poVar2,"\nvoid main() {\n  gl_Position = vec4(0,0,0,1);");
    std::operator<<(poVar2,local_b98);
  }
  if (*(int *)((long)this + 0x50) == 1) {
    poVar2 = std::operator<<((ostream *)local_190,"\nlayout(location = 0) out vec4 o_color;");
    poVar2 = std::operator<<(poVar2,(string *)local_688);
    poVar2 = std::operator<<(poVar2,"\nvoid main() {\n  o_color = vec4(0.0, 1.0, 0.0, 1.0);");
    std::operator<<(poVar2,local_b98);
  }
  if (*(int *)((long)this + 0x50) == 2) {
    poVar2 = std::operator<<((ostream *)local_190,"\nlayout(local_size_x = 1) in;");
    poVar2 = std::operator<<(poVar2,(string *)local_688);
    poVar2 = std::operator<<(poVar2,"\nvoid main() {");
    std::operator<<(poVar2,local_b98);
  }
  std::operator<<((ostream *)local_190,"\n}");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string(local_bc0);
  std::__cxx11::string::~string(local_b98);
  std::__cxx11::string::~string((string *)local_688);
  local_ee0 = (string *)(l[3].field_2._M_local_buf + 8);
  do {
    local_ee0 = local_ee0 + -0x20;
    std::__cxx11::string::~string(local_ee0);
  } while (local_ee0 != local_658);
  std::__cxx11::string::~string((string *)local_5c8);
  std::__cxx11::string::~string((string *)local_5a0);
  local_ef8 = (string *)(e[3][6].field_2._M_local_buf + 8);
  do {
    local_ef8 = local_ef8 + -0x20;
    std::__cxx11::string::~string(local_ef8);
  } while (local_ef8 != local_518);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string BuildShader()
	{
		std::ostringstream os;
		std::string		   e[4][7] = { { "bvec3", "vec4", "ivec3", "ivec3", "uvec2", "vec2", "uvec4" },
								{ "mat2", "mat3", "mat4", "mat4", "mat2x3", "mat3x2", "mat4x2" },
								{ "mat2", "mat3", "mat4", "mat4", "mat2x3", "mat3x2", "mat4x2" },
								{ "S0", "S1", "S2", "S2", "S4", "S5", "S6" } };

		std::string sd =
			NL "struct S0 {" NL "  float f;" NL "  int i;" NL "  uint ui;" NL "  bool b;" NL "};" NL "struct S1 {" NL
			   "  ivec3 iv;" NL "  bvec2 bv;" NL "  vec4 v;" NL "  uvec2 uv;" NL "};" NL "struct S2 {" NL
			   "  mat2x2 m22;" NL "  mat4x4 m44;" NL "  mat2x3 m23;" NL "  mat4x2 m42;" NL "  mat3x4 m34;" NL "};" NL
			   "struct S4 {" NL "  float f[1];" NL "  int i[2];" NL "  uint ui[3];" NL "  bool b[4];" NL
			   "  ivec3 iv[5];" NL "  bvec2 bv[6];" NL "  vec4  v[7];" NL "  uvec2 uv[8];" NL "};" NL "struct S5 {" NL
			   "  S0 s0;" NL "  S1 s1;" NL "  S2 s2;" NL "};" NL "struct S6 {" NL "  S4 s4[3];" NL "};";

		std::string lo   = "";
		std::string l[4] = { "std140", "std430", "shared", "packed" };
		lo += l[layout];

		if (etype == matrix_rm)
			lo += ", row_major";

		std::string decl = sd + NL "layout(" + lo + ") buffer;" NL "layout(binding = 0) readonly buffer Input0 {" +
						   ((other_members) ? ("\n  " + e[etype][0] + " pad0;") : "") + NL "  " + e[etype][0] +
						   " g_input0[];" NL "};" NL "layout(binding = 1) readonly buffer Input1 {" +
						   ((other_members) ? ("\n  " + e[etype][1] + " pad1;") : "") + NL "  " + e[etype][1] +
						   " data[];" NL "} g_input1;" NL "layout(binding = 2) readonly buffer Input23 {" +
						   ((other_members) ? ("\n  " + e[etype][2] + " pad2;") : "") + NL "  " + e[etype][2] +
						   " data[];" NL "} g_input23[2];" NL "layout(binding = 4) buffer Output0 {" +
						   ((other_members) ? ("\n  " + e[etype][4] + " pad4;") : "") + NL "  " + e[etype][4] +
						   " data[];" NL "} g_output0;" NL "layout(binding = 5) readonly buffer Input4 {" +
						   ((other_members) ? ("\n  " + e[etype][5] + " pad5;") : "") + NL "  " + e[etype][5] +
						   " data[];" NL "} g_input4;" NL "layout(binding = 6) buffer Output1 {" +
						   ((other_members) ? ("\n  " + e[etype][6] + " pad6;") : "") + NL "  " + e[etype][6] +
						   " data[];" NL "} g_output1;" NL "layout(std430, binding = 7) buffer Output {" NL
						   "  int g_length[];" NL "};";

		std::string expr =
			NL "  g_length[0] = g_input0.length();" NL "  g_length[1] = g_input1.data.length();" NL
			   "  g_length[2] = g_input23[0].data.length();" NL "  g_length[3] = g_input23[1].data.length();" NL
			   "  g_length[4] = g_output0.data.length();" NL "  g_length[5] = g_input4.data.length();" NL
			   "  g_length[6] = g_output1.data.length();";

		std::string lastelemexpr =
			NL "  g_output0.data[g_output0.data.length()-2] += g_output0.data[g_output0.data.length()-1];" NL
			   "  g_output1.data[g_output1.data.length()-2] += g_output1.data[g_output1.data.length()-1];";

		if (length_as_index)
			expr += lastelemexpr;
		if (stage == vertex)
		{
			os << decl << NL "void main() {" NL "  gl_Position = vec4(0,0,0,1);" << expr;
		}
		if (stage == fragment)
		{
			os << NL "layout(location = 0) out vec4 o_color;" << decl
			   << NL "void main() {" NL "  o_color = vec4(0.0, 1.0, 0.0, 1.0);" << expr;
		}
		if (stage == compute)
		{
			os << NL "layout(local_size_x = 1) in;" << decl << NL "void main() {" << expr;
		}
		os << NL "}";
		return os.str();
	}